

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,VmFunction *argument)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *argument_00;
  ExpressionContext *ctx_00;
  
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
  ctx_00 = (ExpressionContext *)ctx->allocator;
  if (argument == (VmFunction *)0x0) {
    argument_00 = (VmConstant *)0x0;
  }
  else {
    argument_00 = CreateConstantFunction((Allocator *)ctx_00,(SynBase *)0x0,argument);
  }
  RegVmLoweredInstruction::RegVmLoweredInstruction
            ((RegVmLoweredInstruction *)CONCAT44(extraout_var,iVar1),(Allocator *)ctx_00,location,
             code,rA,rB,rC,argument_00);
  AddInstruction(this,ctx_00,(RegVmLoweredInstruction *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, VmFunction *argument)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, rA, rB, rC, argument ? CreateConstantFunction(ctx.allocator, NULL, argument) : NULL));
}